

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O3

void __thiscall dgMatrix::EigenVectors(dgMatrix *this,dgVector *eigenValues,dgMatrix *initialGuess)

{
  dgTemplateVector<float> *this_00;
  bool bVar1;
  dgTemplateVector<float> dVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  float *pfVar19;
  undefined8 in_RCX;
  long lVar20;
  dgTemplateVector<float> *this_01;
  long lVar21;
  HaI32 i;
  ulong uVar22;
  float fVar23;
  undefined1 auVar25 [16];
  float fVar24;
  undefined1 auVar26 [16];
  dgMatrix dVar27;
  undefined1 auVar33 [48];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  HaF32 d [3];
  float local_194 [3];
  ulong local_188;
  float *local_180;
  float local_178;
  float local_174;
  float local_170;
  uint local_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  dgVector *local_140;
  dgMatrix *local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  dgMatrix local_118;
  dgMatrix local_d8;
  dgTemplateVector<float> local_98;
  dgTemplateVector<float> local_88;
  dgMatrix local_70;
  undefined1 auVar28 [64];
  undefined1 auVar32 [64];
  
  local_140 = eigenValues;
  Transpose4X4(&local_118,initialGuess);
  operator*(&local_d8,initialGuess,this);
  operator*(&local_70,&local_d8,&local_118);
  local_188 = 0;
  *this = local_70;
  local_194[0] = (this->m_front).super_dgTemplateVector<float>.m_x;
  local_194[1] = (this->m_up).super_dgTemplateVector<float>.m_y;
  local_194[2] = (this->m_right).super_dgTemplateVector<float>.m_z;
  dVar27 = local_70;
  do {
    dVar2 = local_118.m_right.super_dgTemplateVector<float>;
    local_d8.m_front.super_dgTemplateVector<float>.m_z = 0.0;
    local_d8.m_front.super_dgTemplateVector<float>.m_x = 0.0;
    local_d8.m_front.super_dgTemplateVector<float>.m_y = 0.0;
    uVar22._0_4_ = (this->m_front).super_dgTemplateVector<float>.m_y;
    uVar22._4_4_ = (this->m_front).super_dgTemplateVector<float>.m_z;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar22;
    auVar38._0_8_ = uVar22 ^ 0x8000000080000000;
    auVar38._8_4_ = 0x80000000;
    auVar38._12_4_ = 0x80000000;
    uVar3 = vcmpps_avx512vl(auVar38,auVar26,2);
    auVar28._16_48_ = dVar27._16_48_;
    bVar1 = (bool)((byte)uVar3 & 1);
    auVar25._0_4_ =
         (uint)bVar1 * (undefined4)uVar22 | (uint)!bVar1 * ((undefined4)uVar22 ^ 0x80000000);
    bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar1 * uVar22._4_4_ | (uint)!bVar1 * (uVar22._4_4_ ^ 0x80000000);
    auVar25._8_4_ = (uint)!(bool)((byte)(uVar3 >> 2) & 1) * -0x80000000;
    auVar25._12_4_ = (uint)!(bool)((byte)(uVar3 >> 3) & 1) * -0x80000000;
    auVar25 = vhaddps_avx(auVar25,auVar25);
    fVar37 = (this->m_up).super_dgTemplateVector<float>.m_z;
    auVar45._0_4_ = -fVar37;
    auVar45._4_4_ = 0x80000000;
    auVar45._8_4_ = 0x80000000;
    auVar45._12_4_ = 0x80000000;
    uVar4 = vcmpss_avx512f(auVar45,ZEXT416((uint)fVar37),2);
    bVar1 = (bool)((byte)uVar4 & 1);
    fVar37 = auVar25._0_4_ + (float)((uint)bVar1 * (int)fVar37 + (uint)!bVar1 * (int)auVar45._0_4_);
    if (fVar37 < 1e-06) {
      auVar36._8_8_ = 0;
      auVar36._0_4_ = local_118.m_front.super_dgTemplateVector<float>.m_x;
      auVar36._4_4_ = local_118.m_front.super_dgTemplateVector<float>.m_y;
      auVar25 = vmovshdup_avx(auVar36);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * auVar25._0_4_)),auVar36,auVar36);
      auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)local_118.m_front.
                                                      super_dgTemplateVector<float>.m_z),
                                ZEXT416((uint)local_118.m_front.super_dgTemplateVector<float>.m_z));
      fVar37 = auVar26._0_4_ + -1.0;
      auVar11._8_4_ = 0x80000000;
      auVar11._0_8_ = 0x8000000080000000;
      auVar11._12_4_ = 0x80000000;
      auVar26 = vxorps_avx512vl(ZEXT416((uint)fVar37),auVar11);
      uVar4 = vcmpss_avx512f(auVar26,ZEXT416((uint)fVar37),2);
      bVar1 = (bool)((byte)uVar4 & 1);
      if (1e-05 <= (float)((uint)bVar1 * (int)fVar37 + (uint)!bVar1 * auVar26._0_4_)) {
        __assert_fail("dgAbsf((eigenVectors.m_front % eigenVectors.m_front) - hacd::HaF32(1.0f)) < hacd::HaF32 (1.0e-5f)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                      ,0x1ef,"void dgMatrix::EigenVectors(dgVector &, const dgMatrix &)");
      }
      auVar48._8_8_ = 0;
      auVar48._0_4_ = local_118.m_up.super_dgTemplateVector<float>.m_x;
      auVar48._4_4_ = local_118.m_up.super_dgTemplateVector<float>.m_y;
      auVar26 = vmovshdup_avx(auVar48);
      fVar23 = auVar26._0_4_;
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar48,auVar48);
      auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.
                                                      m_z),
                                ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.m_z));
      fVar37 = auVar26._0_4_ + -1.0;
      auVar12._8_4_ = 0x80000000;
      auVar12._0_8_ = 0x8000000080000000;
      auVar12._12_4_ = 0x80000000;
      auVar26 = vxorps_avx512vl(ZEXT416((uint)fVar37),auVar12);
      uVar4 = vcmpss_avx512f(auVar26,ZEXT416((uint)fVar37),2);
      bVar1 = (bool)((byte)uVar4 & 1);
      if (1e-05 <= (float)((uint)bVar1 * (int)fVar37 + (uint)!bVar1 * auVar26._0_4_)) {
        __assert_fail("dgAbsf((eigenVectors.m_up % eigenVectors.m_up) - hacd::HaF32(1.0f)) < hacd::HaF32 (1.0e-5f)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                      ,0x1f0,"void dgMatrix::EigenVectors(dgVector &, const dgMatrix &)");
      }
      auVar43._8_8_ = 0;
      auVar43._0_4_ = local_118.m_right.super_dgTemplateVector<float>.m_x;
      auVar43._4_4_ = local_118.m_right.super_dgTemplateVector<float>.m_y;
      local_118.m_right.super_dgTemplateVector<float>.m_z = dVar2.m_z;
      auVar26 = vmovshdup_avx(auVar43);
      fVar34 = auVar26._0_4_;
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),auVar43,auVar43);
      auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)local_118.m_right.
                                                      super_dgTemplateVector<float>.m_z),
                                ZEXT416((uint)local_118.m_right.super_dgTemplateVector<float>.m_z));
      fVar37 = auVar26._0_4_ + -1.0;
      auVar13._8_4_ = 0x80000000;
      auVar13._0_8_ = 0x8000000080000000;
      auVar13._12_4_ = 0x80000000;
      auVar26 = vxorps_avx512vl(ZEXT416((uint)fVar37),auVar13);
      uVar4 = vcmpss_avx512f(auVar26,ZEXT416((uint)fVar37),2);
      bVar1 = (bool)((byte)uVar4 & 1);
      if (1e-05 <= (float)((uint)bVar1 * (int)fVar37 + (uint)!bVar1 * auVar26._0_4_)) {
        __assert_fail("dgAbsf((eigenVectors.m_right % eigenVectors.m_right) - hacd::HaF32(1.0f)) < hacd::HaF32 (1.0e-5f)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                      ,0x1f1,"void dgMatrix::EigenVectors(dgVector &, const dgMatrix &)");
      }
      auVar38 = vfmsub231ss_fma(ZEXT416((uint)(fVar23 * local_118.m_front.
                                                        super_dgTemplateVector<float>.m_z)),
                                ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.m_z),
                                auVar25);
      auVar25 = vinsertps_avx(ZEXT416((uint)local_118.m_up.super_dgTemplateVector<float>.m_z),
                              auVar48,0x1c);
      auVar46._0_4_ = auVar25._0_4_ * local_118.m_front.super_dgTemplateVector<float>.m_x;
      auVar46._4_4_ = auVar25._4_4_ * local_118.m_front.super_dgTemplateVector<float>.m_y;
      auVar46._8_4_ = auVar25._8_4_ * 0.0;
      auVar46._12_4_ = auVar25._12_4_ * 0.0;
      auVar25 = vinsertps_avx(ZEXT416((uint)local_118.m_front.super_dgTemplateVector<float>.m_z),
                              auVar36,0x1c);
      auVar26 = vfmsub213ps_fma(auVar25,auVar48,auVar46);
      auVar25 = vpermi2ps_avx512vl(_DAT_009e2030,auVar26,auVar38);
      auVar25 = vinsertps_avx(auVar25,ZEXT416((uint)local_118.m_front.super_dgTemplateVector<float>.
                                                    m_w),0x30);
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx512vl(auVar25,auVar14);
      auVar15._8_4_ = 0x7f7fffff;
      auVar15._0_8_ = 0x7f7fffff7f7fffff;
      auVar15._12_4_ = 0x7f7fffff;
      uVar22 = vpcmpgtd_avx512vl(auVar25,auVar15);
      if ((uVar22 & 0xf) != 0) {
LAB_008593df:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
      }
      auVar25 = vmovshdup_avx(auVar26);
      auVar26 = vfmadd213ss_fma(auVar38,auVar43,ZEXT416((uint)(auVar26._0_4_ * fVar34)));
      auVar25 = vfmadd213ss_fma(auVar25,ZEXT416((uint)local_118.m_right.
                                                      super_dgTemplateVector<float>.m_z),auVar26);
      if (auVar25._0_4_ < 0.0) {
        local_118.m_right.super_dgTemplateVector<float>.m_w = dVar2.m_w;
        auVar25 = vinsertps_avx(auVar43,ZEXT416((uint)local_118.m_right.
                                                      super_dgTemplateVector<float>.m_z),0x20);
        auVar25 = vinsertps_avx(auVar25,ZEXT416((uint)local_118.m_right.
                                                      super_dgTemplateVector<float>.m_w),0x30);
        auVar16._8_4_ = 0x7fffffff;
        auVar16._0_8_ = 0x7fffffff7fffffff;
        auVar16._12_4_ = 0x7fffffff;
        auVar25 = vandps_avx512vl(auVar25,auVar16);
        auVar17._8_4_ = 0x7f7fffff;
        auVar17._0_8_ = 0x7f7fffff7f7fffff;
        auVar17._12_4_ = 0x7f7fffff;
        uVar22 = vpcmpgtd_avx512vl(auVar25,auVar17);
        if ((uVar22 & 0xf) != 0) goto LAB_008593df;
        auVar47._0_4_ = -local_118.m_right.super_dgTemplateVector<float>.m_z;
        auVar47._4_4_ = 0x80000000;
        auVar47._8_4_ = 0x80000000;
        auVar47._12_4_ = 0x80000000;
        auVar44._0_8_ = local_118.m_right.super_dgTemplateVector<float>._0_8_ ^ 0x8000000080000000;
        auVar44._8_4_ = 0x80000000;
        auVar44._12_4_ = 0x80000000;
        auVar25 = vinsertps_avx(auVar47,ZEXT416((uint)local_118.m_right.
                                                      super_dgTemplateVector<float>.m_w),0x1c);
        dVar2 = (dgTemplateVector<float>)vmovlhps_avx(auVar44,auVar25);
      }
      local_118.m_right.super_dgTemplateVector<float> = dVar2;
      if ((((NAN(local_194[2])) || (0x7f7fffff < (uint)ABS(local_194[2]))) || (NAN(local_194[1])))
         || ((0x7f7fffff < (uint)ABS(local_194[0]) || (0x7f7fffff < (uint)ABS(local_194[1])))))
      goto LAB_008593bd;
      (local_140->super_dgTemplateVector<float>).m_x = local_194[0];
      (local_140->super_dgTemplateVector<float>).m_y = local_194[1];
      (local_140->super_dgTemplateVector<float>).m_z = local_194[2];
      (local_140->super_dgTemplateVector<float>).m_w = 0.0;
      Inverse(&local_70,&local_118);
      goto LAB_0085939d;
    }
    fVar37 = fVar37 * 0.022222223;
    uVar22 = 1;
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
    local_130 = 0;
    lVar21 = 0;
    local_180 = local_194;
    local_138 = &local_d8;
    auVar28._0_16_ = ZEXT416((uint)fVar37);
    dVar27._4_60_ = auVar28._4_60_;
    dVar27.m_front.super_dgTemplateVector<float>.m_x =
         (float)((uint)((uint)local_188 < 3) * (int)fVar37);
    local_98 = (dgTemplateVector<float>)dVar27.m_front.super_dgTemplateVector<float>;
    local_178 = local_194[0];
    local_174 = local_194[1];
    local_170 = local_194[2];
    do {
      this_01 = &(&this->m_front)[lVar21].super_dgTemplateVector<float>;
      local_120 = lVar21 + 1;
      local_16c = (uint)in_RCX;
      local_128 = uVar22;
      do {
        auVar33 = dVar27._16_48_;
        i = (HaI32)uVar22;
        pfVar19 = dgTemplateVector<float>::operator[](this_01,i);
        fVar37 = *pfVar19;
        auVar39._0_4_ = -fVar37;
        auVar39._4_4_ = 0x80000000;
        auVar39._8_4_ = 0x80000000;
        auVar39._12_4_ = 0x80000000;
        uVar4 = vcmpss_avx512f(auVar39,ZEXT416((uint)fVar37),2);
        bVar1 = (bool)((byte)uVar4 & 1);
        fVar37 = (float)((uint)bVar1 * (int)fVar37 + (uint)!bVar1 * (int)auVar39._0_4_) * 100.0;
        if ((uint)local_188 < 4) {
LAB_00858c28:
          pfVar19 = dgTemplateVector<float>::operator[](this_01,i);
          fVar23 = *pfVar19;
          auVar6._8_4_ = 0x80000000;
          auVar6._0_8_ = 0x8000000080000000;
          auVar6._12_4_ = 0x80000000;
          auVar30._0_16_ = vxorps_avx512vl(ZEXT416((uint)fVar23),auVar6);
          uVar4 = vcmpss_avx512f(auVar30._0_16_,ZEXT416((uint)fVar23),2);
          bVar1 = (bool)((byte)uVar4 & 1);
          auVar30._16_48_ = auVar33;
          dVar27._4_60_ = auVar30._4_60_;
          dVar27.m_front.super_dgTemplateVector<float>.m_x =
               (float)((uint)bVar1 * (int)fVar23 + (uint)!bVar1 * auVar30._0_4_);
          if (local_98.m_x < dVar27.m_front.super_dgTemplateVector<float>.m_x) {
            fVar23 = *local_180;
            fVar34 = local_194[uVar22] - fVar23;
            auVar7._8_4_ = 0x80000000;
            auVar7._0_8_ = 0x8000000080000000;
            auVar7._12_4_ = 0x80000000;
            auVar25 = vxorps_avx512vl(ZEXT416((uint)fVar34),auVar7);
            uVar4 = vcmpss_avx512f(auVar25,ZEXT416((uint)fVar34),2);
            bVar1 = (bool)((byte)uVar4 & 1);
            fVar24 = (float)((uint)bVar1 * (int)fVar34 + (uint)!bVar1 * auVar25._0_4_);
            if ((fVar24 + fVar37 != fVar24) || (NAN(fVar24 + fVar37) || NAN(fVar24))) {
              pfVar19 = dgTemplateVector<float>::operator[](this_01,i);
              auVar35._0_4_ = (fVar34 * 0.5) / *pfVar19;
              auVar35._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar42._0_4_ = -auVar35._0_4_;
              auVar42._4_4_ = 0x80000000;
              auVar42._8_4_ = 0x80000000;
              auVar42._12_4_ = 0x80000000;
              uVar4 = vcmpss_avx512f(auVar42,auVar35,2);
              bVar1 = (bool)((byte)uVar4 & 1);
              uVar4 = vcmpss_avx512f(auVar35,auVar42,1);
              bVar5 = (bool)((byte)uVar4 & 1);
              auVar25 = vfmadd213ss_fma(auVar35,auVar35,SUB6416(ZEXT464(0x3f800000),0));
              auVar25 = vsqrtss_avx(auVar25,auVar25);
              fVar37 = 1.0 / ((float)((uint)bVar1 * (int)auVar35._0_4_ +
                                     (uint)!bVar1 * (int)auVar42._0_4_) + auVar25._0_4_);
              auVar32._16_48_ = auVar33;
              auVar32._0_16_ = ZEXT416((uint)fVar37);
              auVar31._4_60_ = auVar32._4_60_;
              auVar31._0_4_ = (uint)bVar5 * (int)-fVar37 + (uint)!bVar5 * (int)fVar37;
              auVar25 = auVar31._0_16_;
            }
            else {
              pfVar19 = dgTemplateVector<float>::operator[](this_01,i);
              auVar25 = ZEXT416((uint)(*pfVar19 / fVar34));
            }
            auVar26 = vfmadd213ss_fma(auVar25,auVar25,SUB6416(ZEXT464(0x3f800000),0));
            auVar26 = vsqrtss_avx(auVar26,auVar26);
            fVar34 = 1.0 / auVar26._0_4_;
            fVar37 = auVar25._0_4_ * fVar34;
            fVar34 = fVar37 / (fVar34 + 1.0);
            local_168 = ZEXT416((uint)fVar37);
            pfVar19 = dgTemplateVector<float>::operator[](this_01,i);
            fVar37 = auVar25._0_4_ * *pfVar19;
            (local_138->m_front).super_dgTemplateVector<float>.m_x =
                 (local_138->m_front).super_dgTemplateVector<float>.m_x - fVar37;
            (&local_d8.m_front.super_dgTemplateVector<float>.m_x)[uVar22] =
                 fVar37 + (&local_d8.m_front.super_dgTemplateVector<float>.m_x)[uVar22];
            *local_180 = fVar23 - fVar37;
            local_194[uVar22] = fVar37 + local_194[uVar22];
            pfVar19 = dgTemplateVector<float>::operator[](this_01,i);
            *pfVar19 = 0.0;
            if ((local_130 & 1) != 0) {
              pfVar19 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this,1);
              fVar37 = *pfVar19;
              pfVar19 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this,i);
              fVar23 = *pfVar19;
              auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar37),
                                        ZEXT416((uint)fVar23));
              auVar25 = vfnmadd132ss_fma(auVar25,ZEXT416((uint)fVar37),
                                         ZEXT416((uint)local_168._0_4_));
              local_158._0_4_ = auVar25._0_4_;
              pfVar19 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this,1);
              auVar25 = vfnmadd231ss_fma(ZEXT416((uint)fVar37),ZEXT416((uint)fVar23),
                                         ZEXT416((uint)fVar34));
              auVar25 = vfmadd132ss_fma(auVar25,ZEXT416((uint)fVar23),ZEXT416((uint)local_168._0_4_)
                                       );
              *pfVar19 = (float)local_158._0_4_;
              pfVar19 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this,i);
              *pfVar19 = auVar25._0_4_;
            }
            if (local_120 < uVar22) {
              auVar8._8_4_ = 0x80000000;
              auVar8._0_8_ = 0x8000000080000000;
              auVar8._12_4_ = 0x80000000;
              local_158 = vxorps_avx512vl(local_168,auVar8);
              do {
                fVar37 = this_01->m_y;
                pfVar19 = dgTemplateVector<float>::operator[]
                                    (&(this->m_up).super_dgTemplateVector<float>,i);
                fVar23 = *pfVar19;
                auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar37),
                                          ZEXT416((uint)fVar23));
                auVar25 = vfmadd132ss_fma(auVar25,ZEXT416((uint)fVar37),
                                          ZEXT416((uint)local_158._0_4_));
                this_01->m_y = auVar25._0_4_;
                pfVar19 = dgTemplateVector<float>::operator[]
                                    (&(this->m_up).super_dgTemplateVector<float>,i);
                auVar25 = vfnmadd231ss_fma(ZEXT416((uint)fVar37),ZEXT416((uint)fVar23),
                                           ZEXT416((uint)fVar34));
                auVar25 = vfmadd213ss_fma(auVar25,local_168,ZEXT416((uint)fVar23));
                *pfVar19 = auVar25._0_4_;
              } while (2 < uVar22);
            }
            if (uVar22 == 2) {
              auVar9._8_4_ = 0x80000000;
              auVar9._0_8_ = 0x8000000080000000;
              auVar9._12_4_ = 0x80000000;
              local_88 = (dgTemplateVector<float>)vxorps_avx512vl(local_168,auVar9);
            }
            else {
              fVar37 = this_01->m_z;
              auVar10._8_4_ = 0x80000000;
              auVar10._0_8_ = 0x8000000080000000;
              auVar10._12_4_ = 0x80000000;
              local_88 = (dgTemplateVector<float>)vxorps_avx512vl(local_168,auVar10);
              fVar23 = (&this->m_front)[uVar22].super_dgTemplateVector<float>.m_z;
              auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar37),
                                        ZEXT416((uint)fVar23));
              auVar26 = vfnmadd213ss_fma(auVar25,local_168,ZEXT416((uint)fVar37));
              auVar25 = vfnmadd231ss_fma(ZEXT416((uint)fVar37),ZEXT416((uint)fVar23),
                                         ZEXT416((uint)fVar34));
              auVar25 = vfmadd213ss_fma(auVar25,local_168,ZEXT416((uint)fVar23));
              this_01->m_z = auVar26._0_4_;
              (&this->m_front)[uVar22].super_dgTemplateVector<float>.m_z = auVar25._0_4_;
            }
            auVar25 = auVar33._0_16_;
            auVar26 = auVar33._16_16_;
            auVar38 = auVar33._32_16_;
            dVar27.m_up.super_dgTemplateVector<float>.m_x = (float)auVar25._0_4_;
            dVar27.m_up.super_dgTemplateVector<float>.m_y = (float)auVar25._4_4_;
            dVar27.m_up.super_dgTemplateVector<float>.m_z = (float)auVar25._8_4_;
            dVar27.m_up.super_dgTemplateVector<float>.m_w = (float)auVar25._12_4_;
            dVar27.m_right.super_dgTemplateVector<float>.m_x = (float)auVar26._0_4_;
            dVar27.m_right.super_dgTemplateVector<float>.m_y = (float)auVar26._4_4_;
            dVar27.m_right.super_dgTemplateVector<float>.m_z = (float)auVar26._8_4_;
            dVar27.m_right.super_dgTemplateVector<float>.m_w = (float)auVar26._12_4_;
            dVar27.m_posit.super_dgTemplateVector<float>.m_x = (float)auVar38._0_4_;
            dVar27.m_posit.super_dgTemplateVector<float>.m_y = (float)auVar38._4_4_;
            dVar27.m_posit.super_dgTemplateVector<float>.m_z = (float)auVar38._8_4_;
            dVar27.m_posit.super_dgTemplateVector<float>.m_w = (float)auVar38._12_4_;
            dVar27.m_front.super_dgTemplateVector<float> = local_88;
            lVar20 = 0;
            do {
              this_00 = (dgTemplateVector<float> *)
                        ((long)&local_118.m_front.super_dgTemplateVector<float>.m_x + lVar20);
              pfVar19 = dgTemplateVector<float>::operator[](this_00,(HaI32)lVar21);
              fVar37 = *pfVar19;
              pfVar19 = dgTemplateVector<float>::operator[](this_00,i);
              fVar23 = *pfVar19;
              auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar37),
                                        ZEXT416((uint)fVar23));
              auVar25 = vfmadd132ss_fma(auVar25,ZEXT416((uint)fVar37),ZEXT416((uint)local_88.m_x));
              local_158._0_4_ = auVar25._0_4_;
              pfVar19 = dgTemplateVector<float>::operator[](this_00,(HaI32)lVar21);
              auVar25 = vfnmadd231ss_fma(ZEXT416((uint)fVar37),ZEXT416((uint)fVar23),
                                         ZEXT416((uint)fVar34));
              auVar25 = vfmadd132ss_fma(auVar25,ZEXT416((uint)fVar23),ZEXT416((uint)local_168._0_4_)
                                       );
              *pfVar19 = (float)local_158._0_4_;
              pfVar19 = dgTemplateVector<float>::operator[](this_00,i);
              lVar20 = lVar20 + 0x10;
              *pfVar19 = auVar25._0_4_;
            } while (lVar20 != 0x30);
          }
        }
        else {
          fVar23 = *local_180;
          auVar40._0_4_ = -fVar23;
          auVar40._4_4_ = 0x80000000;
          auVar40._8_4_ = 0x80000000;
          auVar40._12_4_ = 0x80000000;
          uVar4 = vcmpss_avx512f(auVar40,ZEXT416((uint)fVar23),2);
          bVar1 = (bool)((byte)uVar4 & 1);
          fVar23 = (float)((uint)bVar1 * (int)fVar23 + (uint)!bVar1 * (int)auVar40._0_4_);
          if ((fVar37 + fVar23 != fVar23) || (NAN(fVar37 + fVar23) || NAN(fVar23)))
          goto LAB_00858c28;
          fVar23 = local_194[uVar22];
          auVar41._0_4_ = -fVar23;
          auVar41._4_4_ = 0x80000000;
          auVar41._8_4_ = 0x80000000;
          auVar41._12_4_ = 0x80000000;
          uVar4 = vcmpss_avx512f(auVar41,ZEXT416((uint)fVar23),2);
          bVar1 = (bool)((byte)uVar4 & 1);
          auVar29._16_48_ = auVar33;
          auVar29._0_16_ = auVar41;
          dVar27._4_60_ = auVar29._4_60_;
          dVar27.m_front.super_dgTemplateVector<float>.m_x =
               (float)((uint)bVar1 * (int)fVar23 + (uint)!bVar1 * (int)auVar41._0_4_);
          if ((fVar37 + dVar27.m_front.super_dgTemplateVector<float>.m_x !=
               dVar27.m_front.super_dgTemplateVector<float>.m_x) ||
             (NAN(fVar37 + dVar27.m_front.super_dgTemplateVector<float>.m_x) ||
              NAN(dVar27.m_front.super_dgTemplateVector<float>.m_x))) goto LAB_00858c28;
          pfVar19 = dgTemplateVector<float>::operator[](this_01,i);
          *pfVar19 = 0.0;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != 3);
      local_130 = CONCAT71((int7)((ulong)pfVar19 >> 8),1);
      lVar21 = 1;
      in_RCX = 0;
      local_180 = local_194 + 1;
      local_138 = (dgMatrix *)&local_d8.m_front.super_dgTemplateVector<float>.m_y;
      uVar22 = local_128 + 1;
    } while ((local_16c & 1) != 0);
    local_194[0] = local_178 + local_d8.m_front.super_dgTemplateVector<float>.m_x;
    local_194[1] = local_174 + local_d8.m_front.super_dgTemplateVector<float>.m_y;
    local_194[2] = local_170 + local_d8.m_front.super_dgTemplateVector<float>.m_z;
    uVar18 = (int)local_188 + 1;
    local_188 = (ulong)uVar18;
  } while (uVar18 != 0x32);
  if ((((NAN(local_194[2])) || (0x7f7fffff < (uint)ABS(local_194[2]))) || (NAN(local_194[1]))) ||
     ((0x7f7fffff < (uint)ABS(local_194[0]) || (0x7f7fffff < (uint)ABS(local_194[1]))))) {
LAB_008593bd:
    local_d8.m_front.super_dgTemplateVector<float>.m_z = 0.0;
    local_d8.m_front.super_dgTemplateVector<float>.m_x = 0.0;
    local_d8.m_front.super_dgTemplateVector<float>.m_y = 0.0;
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
  }
  (local_140->super_dgTemplateVector<float>).m_x = local_194[0];
  (local_140->super_dgTemplateVector<float>).m_y = local_194[1];
  (local_140->super_dgTemplateVector<float>).m_z = local_194[2];
  (local_140->super_dgTemplateVector<float>).m_w = 0.0;
  local_70 = identityMatrix;
LAB_0085939d:
  *this = local_70;
  return;
}

Assistant:

void dgMatrix::EigenVectors (dgVector &eigenValues, const dgMatrix& initialGuess)
{
	hacd::HaF32 b[3];
	hacd::HaF32 z[3];
	hacd::HaF32 d[3];

	dgMatrix& mat = *this;
	dgMatrix eigenVectors (initialGuess.Transpose4X4());
	mat = initialGuess * mat * eigenVectors;

	b[0] = mat[0][0]; 
	b[1] = mat[1][1];
	b[2] = mat[2][2];

	d[0] = mat[0][0]; 
	d[1] = mat[1][1]; 
	d[2] = mat[2][2]; 

	z[0] = hacd::HaF32 (0.0f);
	z[1] = hacd::HaF32 (0.0f);
	z[2] = hacd::HaF32 (0.0f);

	for (hacd::HaI32 i = 0; i < 50; i++) {
		hacd::HaF32 sm = dgAbsf(mat[0][1]) + dgAbsf(mat[0][2]) + dgAbsf(mat[1][2]);

		if (sm < hacd::HaF32 (1.0e-6f)) {
			HACD_ASSERT (dgAbsf((eigenVectors.m_front % eigenVectors.m_front) - hacd::HaF32(1.0f)) < dgEPSILON);
			HACD_ASSERT (dgAbsf((eigenVectors.m_up % eigenVectors.m_up) - hacd::HaF32(1.0f)) < dgEPSILON);
			HACD_ASSERT (dgAbsf((eigenVectors.m_right % eigenVectors.m_right) - hacd::HaF32(1.0f)) < dgEPSILON);

			// order the eigenvalue vectors	
			dgVector tmp (eigenVectors.m_front * eigenVectors.m_up);
			if (tmp % eigenVectors.m_right < hacd::HaF32(0.0f)) {
				eigenVectors.m_right = eigenVectors.m_right.Scale (-hacd::HaF32(1.0f));
			}

			eigenValues = dgVector (d[0], d[1], d[2], hacd::HaF32 (0.0f));
			*this = eigenVectors.Inverse();
			return;
		}

		hacd::HaF32 thresh = hacd::HaF32 (0.0f);
		if (i < 3) {
			thresh = (hacd::HaF32)(0.2f / 9.0f) * sm;
		}

		for (hacd::HaI32 ip = 0; ip < 2; ip ++) {
			for (hacd::HaI32 iq = ip + 1; iq < 3; iq ++) {
				hacd::HaF32 g = hacd::HaF32 (100.0f) * dgAbsf(mat[ip][iq]);
				//if ((i > 3) && (dgAbsf(d[0]) + g == dgAbsf(d[ip])) && (dgAbsf(d[1]) + g == dgAbsf(d[1]))) {
				if ((i > 3) && ((dgAbsf(d[ip]) + g) == dgAbsf(d[ip])) && ((dgAbsf(d[iq]) + g) == dgAbsf(d[iq]))) {
					mat[ip][iq] = hacd::HaF32 (0.0f);
				} else if (dgAbsf(mat[ip][iq]) > thresh) {

					hacd::HaF32 t;
					hacd::HaF32 h = d[iq] - d[ip];
					if (dgAbsf(h) + g == dgAbsf(h)) {
						t = mat[ip][iq] / h;
					} else {
						hacd::HaF32 theta = hacd::HaF32 (0.5f) * h / mat[ip][iq];
						t = hacd::HaF32(1.0f) / (dgAbsf(theta) + dgSqrt(hacd::HaF32(1.0f) + theta * theta));
						if (theta < hacd::HaF32 (0.0f)) {
							t = -t;
						}
					}
					hacd::HaF32 c = hacd::HaF32(1.0f) / dgSqrt (hacd::HaF32 (1.0f) + t * t); 
					hacd::HaF32 s = t * c; 
					hacd::HaF32 tau = s / (hacd::HaF32(1.0f) + c); 
					h = t * mat[ip][iq];
					z[ip] -= h; 
					z[iq] += h; 
					d[ip] -= h; 
					d[iq] += h;
					mat[ip][iq] = hacd::HaF32(0.0f);

					for (hacd::HaI32 j = 0; j <= ip - 1; j ++) {
						//ROT (mat, j, ip, j, iq, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = mat[j][ip]; 
						hacd::HaF32 h = mat[j][iq]; 
						mat[j][ip] = g - s * (h + g * tau); 
						mat[j][iq] = h + s * (g - h * tau);

					}
					for (hacd::HaI32 j = ip + 1; j <= iq - 1; j ++) {
						//ROT (mat, ip, j, j, iq, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = mat[ip][j]; 
						hacd::HaF32 h = mat[j][iq]; 
						mat[ip][j] = g - s * (h + g * tau); 
						mat[j][iq] = h + s * (g - h * tau);
					}
					for (hacd::HaI32 j = iq + 1; j < 3; j ++) {
						//ROT (mat, ip, j, iq, j, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = mat[ip][j]; 
						hacd::HaF32 h = mat[iq][j]; 
						mat[ip][j] = g - s * (h + g * tau); 
						mat[iq][j] = h + s * (g - h * tau);
					}

					for (hacd::HaI32 j = 0; j < 3; j ++) {
						//ROT (eigenVectors, j, ip, j, iq, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = eigenVectors[j][ip]; 
						hacd::HaF32 h = eigenVectors[j][iq]; 
						eigenVectors[j][ip] = g - s * (h + g * tau); 
						eigenVectors[j][iq] = h + s * (g - h * tau);
					}
				}
			}
		}
		b[0] += z[0]; d[0] = b[0]; z[0] = hacd::HaF32 (0.0f);
		b[1] += z[1]; d[1] = b[1]; z[1] = hacd::HaF32 (0.0f);
		b[2] += z[2]; d[2] = b[2]; z[2] = hacd::HaF32 (0.0f);
	}

	eigenValues = dgVector (d[0], d[1], d[2], hacd::HaF32 (0.0f));
	*this = dgGetIdentityMatrix();
}